

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * QLocale::territoryToCode(QString *__return_storage_ptr__,Territory territory)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = territory - 0x106 & 0xffff;
  puVar2 = (uchar *)(ulong)uVar1;
  this = (QString *)0x0;
  puVar3 = (uchar *)0x0;
  if (0xfefa < uVar1) {
    puVar2 = "ZZ";
    puVar3 = "ZZ" + (ulong)territory * 3;
    this = (QString *)(3 - (ulong)("ZZ"[(ulong)territory * 3 + 2] == '\0'));
  }
  if (puVar3 == (uchar *)0x0) {
    this = (QString *)0x0;
  }
  ba.m_data = (storage_type *)puVar2;
  ba.m_size = (qsizetype)puVar3;
  QString::fromLatin1(&local_38,this,ba);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  (__return_storage_ptr__->d).size = local_38.d.size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::territoryToCode(QLocale::Territory territory)
{
    return QLocalePrivate::territoryToCode(territory);
}